

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

UniValue * __thiscall
CRPCTable::execute(UniValue *__return_storage_ptr__,CRPCTable *this,JSONRPCRequest *request)

{
  bool bVar1;
  const_iterator cVar2;
  UniValue *pUVar3;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock16;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &g_rpc_warmup_mutex;
  local_48[8] = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  if (fRPCInWarmup == '\0') {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    JSONRPCError(pUVar3,-0x1c,&rpcWarmupStatus_abi_cxx11_);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar3,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
                    *)this,&request->strMethod);
    if ((_Rb_tree_header *)cVar2._M_node != &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header)
    {
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      (__return_storage_ptr__->val)._M_string_length = 0;
      (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->typ = VNULL;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ExecuteCommands((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                              (cVar2._M_node + 2),request,__return_storage_ptr__);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return __return_storage_ptr__;
        }
        goto LAB_003b4340;
      }
      ::UniValue::~UniValue(__return_storage_ptr__);
    }
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Method not found","");
    JSONRPCError(pUVar3,-0x7f59,(string *)local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar3,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
LAB_003b4340:
  __stack_chk_fail();
}

Assistant:

UniValue CRPCTable::execute(const JSONRPCRequest &request) const
{
    // Return immediately if in warmup
    {
        LOCK(g_rpc_warmup_mutex);
        if (fRPCInWarmup)
            throw JSONRPCError(RPC_IN_WARMUP, rpcWarmupStatus);
    }

    // Find method
    auto it = mapCommands.find(request.strMethod);
    if (it != mapCommands.end()) {
        UniValue result;
        if (ExecuteCommands(it->second, request, result)) {
            return result;
        }
    }
    throw JSONRPCError(RPC_METHOD_NOT_FOUND, "Method not found");
}